

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::BuildXformNodeFromStageRec
               (Stage *stage,Path *parent_abs_path,Prim *prim,XformNode *nodeOut,matrix4d rootMat,
               double t,TimeSampleInterpolationType tinterp)

{
  pointer pcVar1;
  optional<tinyusdz::Path::PathType> oVar2;
  Prim *pPVar3;
  bool bVar4;
  long lVar5;
  Path *parent_abs_path_00;
  matrix4d *pmVar6;
  undefined8 *puVar7;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  *psVar8;
  matrix4d *pmVar9;
  double *pdVar10;
  optional<tinyusdz::Token> *poVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  bool resetXformStack;
  matrix4d localMat;
  matrix4d worldMat;
  matrix4d ret;
  matrix4d in_stack_fffffffffffff858;
  bool local_71d;
  TimeSampleInterpolationType local_71c;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *local_718;
  double local_710;
  Prim *local_708;
  pointer local_700;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *local_6f8;
  Path *local_6f0;
  double local_6e8;
  anon_struct_8_0_00000001_for___align aStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  anon_struct_8_0_00000001_for___align aStack_6c0;
  pointer local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  anon_struct_8_0_00000001_for___align local_698;
  pointer pcStack_690;
  undefined1 local_680 [272];
  _Alloc_hider local_570;
  size_type sStack_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  _Alloc_hider local_550;
  size_type sStack_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  _Alloc_hider local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_520;
  _Alloc_hider _Stack_510;
  size_type local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  optional<tinyusdz::Path::PathType> local_4f0;
  undefined8 uStack_4e8;
  _Alloc_hider local_4e0;
  size_type sStack_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Alloc_hider local_4c0;
  size_type sStack_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider _Stack_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_490;
  _Alloc_hider local_480;
  size_type sStack_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  size_type sStack_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  size_type sStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  optional<tinyusdz::Path::PathType> oStack_420;
  undefined8 local_418;
  _Alloc_hider _Stack_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  undefined8 local_3f0;
  storage_union sStack_3e8;
  vtable_type *local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [32];
  _Alloc_hider local_398;
  _Base_ptr local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined8 local_358;
  _Base_ptr local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  size_type local_330;
  undefined1 local_328 [48];
  bool local_2f8;
  storage_t<tinyusdz::Path::PathType> local_2f4;
  undefined1 local_2f0 [48];
  optional<double> oStack_2c0;
  optional<tinyusdz::Token> local_2b0;
  optional<tinyusdz::Token> local_288;
  optional<tinyusdz::Token> local_260;
  optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_238;
  double local_200;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1f8;
  double local_1d8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1d0;
  double dStack_1b0;
  storage_t<tinyusdz::Token> local_1a8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_188;
  pointer local_158;
  pointer pSStack_150;
  pointer local_148;
  pointer pPStack_140;
  pointer local_138;
  matrix4d local_130;
  undefined1 local_b0 [72];
  double dStack_68;
  storage_t<double> local_60;
  double local_58;
  storage_t<tinyusdz::Token> sStack_50;
  
  bVar12 = 0;
  local_71c = (TimeSampleInterpolationType)nodeOut;
  if (prim == (Prim *)0x0) {
    bVar4 = false;
  }
  else {
    local_3d8 = (vtable_type *)local_3c8;
    local_3d0 = (pointer)0x0;
    local_3c8[0] = 0;
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8._8_8_ = (pointer)0x0;
    local_3b8[0x10] = '\0';
    local_398._M_p = (pointer)&local_388;
    local_390 = (_Base_ptr)0x0;
    local_388._M_local_buf[0] = '\0';
    local_378._M_p = (pointer)&local_368;
    local_370._M_p = (pointer)0x0;
    local_368._M_local_buf[0] = '\0';
    local_358 = &local_348;
    local_350 = (_Base_ptr)0x0;
    local_348._M_local_buf[0] = '\0';
    local_700 = local_328;
    local_330 = 0;
    local_328[0] = '\0';
    local_328._16_8_ = local_328 + 0x20;
    local_328._24_8_ = 0;
    local_328[0x20] = '\0';
    local_2f8 = false;
    local_2f4 = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_2f0[0] = false;
    local_2f0._8_8_ = 0;
    local_2f0._16_8_ = 0xffffffffffffffff;
    local_2f0._40_8_ = 0;
    oStack_2c0.has_value_ = false;
    oStack_2c0._1_7_ = 0;
    local_2f0._24_8_ = 0;
    local_2f0._32_8_ = 0;
    oStack_2c0.contained._0_2_ = 0;
    local_2b0.has_value_ = false;
    local_2b0._1_7_ = 0x3ff00000000000;
    local_2b0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_2b0.contained._8_8_ = 0;
    local_2b0.contained._16_8_ = 0;
    local_2b0.contained._24_8_ = 0;
    local_288.has_value_ = false;
    local_288._1_7_ = 0x3ff00000000000;
    local_288.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_288.contained._8_8_ = 0;
    local_288.contained._16_8_ = 0;
    local_288.contained._24_8_ = 0;
    local_260.has_value_ = false;
    local_260._1_7_ = 0x3ff00000000000;
    local_260.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_260.contained._8_8_ = 0;
    local_260.contained._16_8_ = 0;
    local_260.contained._24_8_ = 0;
    local_238.has_value_ = false;
    local_238._1_7_ = 0x3ff00000000000;
    local_238.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x3ff0000000000000;
    local_238.contained._8_8_ = 0.0;
    local_238.contained._16_8_ = 0.0;
    local_238.contained._24_8_ = 0.0;
    local_238.contained._32_8_ = (pointer)0x0;
    local_238.contained._40_8_ = 0x3ff0000000000000;
    local_200 = 0.0;
    sStack_1f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_1f8._8_8_ = (pointer)0x0;
    sStack_1f8._16_8_ = 0.0;
    sStack_1f8._24_8_ = 0x3ff0000000000000;
    local_1d8 = 0.0;
    sStack_1d0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    sStack_1d0._8_8_ = 0.0;
    sStack_1d0._16_8_ = 0.0;
    sStack_1d0._24_8_ = 0x3ff0000000000000;
    dStack_1b0 = 1.0;
    local_1a8._16_8_ = 0;
    local_1a8._24_8_ = 0;
    local_1a8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1a8._8_8_ = 0;
    local_188._0_8_ = 0x3ff0000000000000;
    local_188.super__Rb_tree_header._M_header._M_color = _S_red;
    local_188.super__Rb_tree_header._M_header._4_4_ = 0;
    local_188.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_188.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_188.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_188.super__Rb_tree_header._M_node_count = 0x3ff0000000000000;
    local_158 = (pointer)0x0;
    pSStack_150 = (pointer)0x0;
    local_148 = (pointer)0x0;
    pPStack_140 = (pointer)0x0;
    local_138 = (pointer)0x3ff0000000000000;
    local_710 = t;
    local_708 = prim;
    local_338._M_p = local_700;
    ::std::__cxx11::string::_M_assign((string *)&local_3d8);
    Path::AppendPrim((Path *)local_680,(Path *)stage,(string *)(parent_abs_path + 2));
    Path::operator=((Path *)local_3b8,(Path *)local_680);
    if ((undefined1 *)local_680._160_8_ != local_680 + 0xb0) {
      operator_delete((void *)local_680._160_8_,CONCAT71(local_680._177_7_,local_680[0xb0]) + 1);
    }
    if ((undefined1 *)local_680._128_8_ != local_680 + 0x90) {
      operator_delete((void *)local_680._128_8_,CONCAT71(local_680._145_7_,local_680[0x90]) + 1);
    }
    if ((undefined1 *)local_680._96_8_ != local_680 + 0x70) {
      operator_delete((void *)local_680._96_8_,CONCAT71(local_680._113_7_,local_680[0x70]) + 1);
    }
    if ((undefined1 *)local_680._64_8_ != local_680 + 0x50) {
      operator_delete((void *)local_680._64_8_,CONCAT71(local_680._81_7_,local_680[0x50]) + 1);
    }
    if ((undefined1 *)local_680._32_8_ != local_680 + 0x30) {
      operator_delete((void *)local_680._32_8_,CONCAT71(local_680._49_7_,local_680[0x30]) + 1);
    }
    if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
      operator_delete((void *)local_680._0_8_,CONCAT71(local_680._17_7_,local_680[0x10]) + 1);
    }
    local_2f0._16_8_ = parent_abs_path[3]._element._M_string_length;
    local_2f0._8_8_ = parent_abs_path;
    bVar4 = IsXformablePrim((Prim *)parent_abs_path);
    if (bVar4) {
      local_71d = false;
      GetLocalTransform((matrix4d *)local_680,(Prim *)parent_abs_path,&local_71d,local_710,local_71c
                       );
      pmVar6 = &rootMat;
      pmVar9 = &local_130;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pmVar9->m[0][0] = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pmVar9 = (matrix4d *)((long)pmVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      oStack_2c0.contained._1_1_ = local_71d;
      if (local_71d == true) {
        uVar13 = (undefined4)local_680._0_8_;
        uVar14 = SUB84(local_680._0_8_,4);
        dStack_6a0 = (double)CONCAT71(local_680._17_7_,local_680[0x10]);
        local_6a8 = (double)local_680._8_8_;
        local_698 = (anon_struct_8_0_00000001_for___align)local_680._24_8_;
        pcStack_690 = (pointer)local_680._32_8_;
        uVar15 = (undefined4)local_680._40_8_;
        uVar16 = SUB84(local_680._40_8_,4);
        local_6c8 = (double)CONCAT71(local_680._49_7_,local_680[0x30]);
        aStack_6c0 = (anon_struct_8_0_00000001_for___align)local_680._56_8_;
        local_6b8 = (pointer)local_680._64_8_;
        dStack_6b0 = (double)local_680._72_8_;
        uVar17 = (undefined4)CONCAT71(local_680._81_7_,local_680[0x50]);
        uVar18 = SUB74(local_680._81_7_,3);
        local_6e8 = (double)local_680._88_8_;
        aStack_6e0 = (anon_struct_8_0_00000001_for___align)local_680._96_8_;
        dStack_6d0 = (double)CONCAT71(local_680._113_7_,local_680[0x70]);
        local_6d8 = (double)local_680._104_8_;
        uVar19 = (undefined4)local_680._120_8_;
        uVar20 = SUB84(local_680._120_8_,4);
      }
      else {
        tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
                  ((matrix4d *)local_b0,(value *)local_680,&local_130,(matrix4d *)0x0);
        uVar13 = (undefined4)local_b0._0_8_;
        uVar14 = SUB84(local_b0._0_8_,4);
        local_6a8 = (double)local_b0._8_8_;
        dStack_6a0 = (double)local_b0._16_8_;
        local_698 = (anon_struct_8_0_00000001_for___align)local_b0._24_8_;
        pcStack_690 = (pointer)local_b0._32_8_;
        uVar15 = (undefined4)local_b0._40_8_;
        uVar16 = SUB84(local_b0._40_8_,4);
        local_6c8 = (double)local_b0._48_8_;
        aStack_6c0 = (anon_struct_8_0_00000001_for___align)local_b0._56_8_;
        local_6b8 = (pointer)local_b0._64_8_;
        dStack_6b0 = dStack_68;
        uVar17 = local_60._0_4_;
        uVar18 = local_60._4_4_;
        local_6e8 = local_58;
        aStack_6e0 = sStack_50.data.__align;
        local_6d8 = (double)sStack_50._8_8_;
        dStack_6d0 = (double)sStack_50._16_8_;
        uVar19 = (undefined4)sStack_50._24_8_;
        uVar20 = (undefined4)((ulong)sStack_50._24_8_ >> 0x20);
      }
      pmVar6 = &rootMat;
      pdVar10 = &dStack_1b0;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      puVar7 = (undefined8 *)local_680;
      poVar11 = &local_2b0;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(undefined8 *)poVar11 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        poVar11 = (optional<tinyusdz::Token> *)((long)poVar11 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      local_238.contained._4_4_ = uVar14;
      local_238.contained._0_4_ = uVar13;
      local_238.contained._24_8_ = local_698;
      local_238.contained._32_8_ = pcStack_690;
      local_238.contained._8_8_ = local_6a8;
      local_238.contained._16_8_ = dStack_6a0;
      local_238.contained._40_8_ = CONCAT44(uVar16,uVar15);
      sStack_1f8._8_8_ = local_6b8;
      sStack_1f8._16_8_ = dStack_6b0;
      local_200 = local_6c8;
      sStack_1f8.data.__align = aStack_6c0;
      sStack_1f8._24_8_ = CONCAT44(uVar18,uVar17);
      sStack_1d0._8_8_ = local_6d8;
      sStack_1d0._16_8_ = dStack_6d0;
      local_1d8 = local_6e8;
      sStack_1d0.data.__align = aStack_6e0;
      sStack_1d0._24_8_ = CONCAT44(uVar20,uVar19);
      oStack_2c0.contained._0_1_ = 1;
    }
    else {
      oStack_2c0.contained._0_2_ = 0;
      pmVar6 = &rootMat;
      pdVar10 = &dStack_1b0;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar10 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        pdVar10 = pdVar10 + (ulong)bVar12 * -2 + 1;
      }
      pmVar6 = &rootMat;
      psVar8 = &local_238.contained;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(double *)psVar8 = pmVar6->m[0][0];
        pmVar6 = (matrix4d *)((long)pmVar6 + ((ulong)bVar12 * -2 + 1) * 8);
        psVar8 = (storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                  *)((long)psVar8 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      local_2b0.contained._16_8_ = 0;
      local_2b0.contained._24_8_ = 0;
      local_2b0.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_2b0.contained._8_8_ = 0;
      local_288.contained._16_8_ = 0;
      local_288.contained._24_8_ = 0;
      local_288.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_288.contained._8_8_ = 0;
      local_260.contained._16_8_ = 0;
      local_260.contained._24_8_ = 0;
      local_260.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_260.contained._8_8_ = 0;
      local_2b0.has_value_ = false;
      local_2b0._1_7_ = 0x3ff00000000000;
      local_288.has_value_ = false;
      local_288._1_7_ = 0x3ff00000000000;
      local_260.has_value_ = false;
      local_260._1_7_ = 0x3ff00000000000;
      local_238.has_value_ = false;
      local_238._1_7_ = 0x3ff00000000000;
    }
    parent_abs_path_00 = (Path *)parent_abs_path[3]._variant_part._M_dataplus._M_p;
    local_6f0 = (Path *)parent_abs_path[3]._variant_part._M_string_length;
    if (parent_abs_path_00 != local_6f0) {
      pcVar1 = local_680 + 0xb0;
      oVar2 = (optional<tinyusdz::Path::PathType>)((long)local_680 + 0xd0);
      local_6f8 = (vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *
                  )(local_2f0 + 0x20);
      local_718 = (vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *
                  )(local_680 + 0x108);
      do {
        local_680._0_8_ = local_680 + 0x10;
        local_680._8_8_ = 0.0;
        local_680[0x10] = '\0';
        local_680._32_8_ = local_680 + 0x30;
        local_680._40_8_ = 0.0;
        local_680[0x30] = '\0';
        local_680._64_8_ = local_680 + 0x50;
        local_680._72_8_ = 0.0;
        local_680[0x50] = '\0';
        local_680._96_8_ = local_680 + 0x70;
        local_680._104_8_ = 0.0;
        local_680[0x70] = '\0';
        local_680._128_8_ = local_680 + 0x90;
        local_680._136_8_ = 0;
        local_680[0x90] = '\0';
        local_680._160_8_ = pcVar1;
        local_680._168_8_ = 0;
        local_680[0xb0] = '\0';
        local_680._192_8_ = oVar2;
        local_680._200_8_ = 0;
        local_680[0xd0] = 0;
        local_680[0xe0] = '\0';
        local_680._228_4_ = 0;
        local_680[0xe8] = '\0';
        local_680._240_8_ = (pointer)0x0;
        local_680._248_8_ = 0xffffffffffffffff;
        local_570._M_p = (pointer)0x0;
        sStack_568 = 0;
        local_680._256_8_ = (vtable_type **)0x0;
        local_680._264_8_ = 0;
        local_560._M_allocated_capacity._0_2_ = 0;
        local_560._8_8_ = 0x3ff0000000000000;
        local_540._M_allocated_capacity = 0;
        local_540._8_8_ = 0;
        local_550._M_p = (pointer)0x0;
        sStack_548 = 0;
        local_530._M_p = (pointer)0x3ff0000000000000;
        aStack_520._8_8_ = 0;
        _Stack_510._M_p = (pointer)0x0;
        local_528 = 0;
        aStack_520._M_allocated_capacity = 0;
        local_508 = 0x3ff0000000000000;
        local_4f0.has_value_ = false;
        local_4f0._1_3_ = 0;
        local_4f0.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        uStack_4e8._0_1_ = false;
        uStack_4e8._1_7_ = 0;
        local_500._M_allocated_capacity = 0;
        local_500._8_8_ = 0;
        local_4e0._M_p = (pointer)0x3ff0000000000000;
        sStack_4d8 = 0x3ff0000000000000;
        local_4c0._M_p = (pointer)0x0;
        sStack_4b8 = 0;
        local_4d0._M_allocated_capacity = 0;
        local_4d0._8_8_ = 0;
        local_4b0._M_allocated_capacity = 0x3ff0000000000000;
        local_498 = 0;
        aStack_490._M_allocated_capacity = 0;
        local_4b0._8_8_ = 0;
        _Stack_4a0._M_p = (pointer)0x0;
        aStack_490._8_8_ = 0x3ff0000000000000;
        local_470._M_allocated_capacity = 0;
        local_470._8_8_ = 0;
        local_480._M_p = (pointer)0x0;
        sStack_478 = 0;
        local_460._M_p = (pointer)0x3ff0000000000000;
        sStack_458 = 0x3ff0000000000000;
        local_440._M_p = (pointer)0x0;
        sStack_438 = 0;
        local_450._M_allocated_capacity = 0;
        local_450._8_8_ = 0;
        local_430._M_allocated_capacity = 0x3ff0000000000000;
        local_418._0_1_ = false;
        local_418._1_7_ = 0;
        _Stack_410._M_p = (pointer)0x0;
        local_430._8_8_ = 0;
        oStack_420.has_value_ = false;
        oStack_420._1_3_ = 0;
        oStack_420.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_408 = 0x3ff0000000000000;
        local_3f0._0_4_ = Def;
        local_3f0._4_4_ = 0;
        sStack_3e8.dynamic = (void *)0x0;
        local_400._M_allocated_capacity = 0;
        local_400._8_8_ = 0;
        sStack_3e8._8_8_ = 0x3ff0000000000000;
        psVar8 = &local_238.contained;
        puVar7 = (undefined8 *)&stack0xfffffffffffff858;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar7 = *(undefined8 *)psVar8;
          psVar8 = (storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                    *)((long)psVar8 + ((ulong)bVar12 * -2 + 1) * 8);
          puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        }
        bVar4 = BuildXformNodeFromStageRec
                          ((Stage *)local_3b8,parent_abs_path_00,(Prim *)local_680,
                           (XformNode *)(ulong)local_71c,in_stack_fffffffffffff858,local_710,tinterp
                          );
        if (!bVar4) {
          ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
          ~vector(local_718);
          if ((optional<tinyusdz::Path::PathType>)local_680._192_8_ != oVar2) {
            operator_delete((void *)local_680._192_8_,
                            CONCAT71(local_680._209_7_,local_680[0xd0]) + 1);
          }
          if ((pointer)local_680._160_8_ != pcVar1) {
            operator_delete((void *)local_680._160_8_,
                            CONCAT71(local_680._177_7_,local_680[0xb0]) + 1);
          }
          if ((undefined1 *)local_680._128_8_ != local_680 + 0x90) {
            operator_delete((void *)local_680._128_8_,
                            CONCAT71(local_680._145_7_,local_680[0x90]) + 1);
          }
          if ((undefined1 *)local_680._96_8_ != local_680 + 0x70) {
            operator_delete((void *)local_680._96_8_,CONCAT71(local_680._113_7_,local_680[0x70]) + 1
                           );
          }
          if ((undefined1 *)local_680._64_8_ != local_680 + 0x50) {
            operator_delete((void *)local_680._64_8_,CONCAT71(local_680._81_7_,local_680[0x50]) + 1)
            ;
          }
          if ((undefined1 *)local_680._32_8_ != local_680 + 0x30) {
            operator_delete((void *)local_680._32_8_,CONCAT71(local_680._49_7_,local_680[0x30]) + 1)
            ;
          }
          if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
            operator_delete((void *)local_680._0_8_,CONCAT71(local_680._17_7_,local_680[0x10]) + 1);
          }
          bVar4 = false;
          goto LAB_004d2127;
        }
        local_680._256_8_ = &local_3d8;
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        emplace_back<tinyusdz::tydra::XformNode>(local_6f8,(XformNode *)local_680);
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        ~vector(local_718);
        if ((optional<tinyusdz::Path::PathType>)local_680._192_8_ != oVar2) {
          operator_delete((void *)local_680._192_8_,CONCAT71(local_680._209_7_,local_680[0xd0]) + 1)
          ;
        }
        if ((pointer)local_680._160_8_ != pcVar1) {
          operator_delete((void *)local_680._160_8_,CONCAT71(local_680._177_7_,local_680[0xb0]) + 1)
          ;
        }
        if ((undefined1 *)local_680._128_8_ != local_680 + 0x90) {
          operator_delete((void *)local_680._128_8_,CONCAT71(local_680._145_7_,local_680[0x90]) + 1)
          ;
        }
        if ((undefined1 *)local_680._96_8_ != local_680 + 0x70) {
          operator_delete((void *)local_680._96_8_,CONCAT71(local_680._113_7_,local_680[0x70]) + 1);
        }
        if ((undefined1 *)local_680._64_8_ != local_680 + 0x50) {
          operator_delete((void *)local_680._64_8_,CONCAT71(local_680._81_7_,local_680[0x50]) + 1);
        }
        if ((undefined1 *)local_680._32_8_ != local_680 + 0x30) {
          operator_delete((void *)local_680._32_8_,CONCAT71(local_680._49_7_,local_680[0x30]) + 1);
        }
        if ((undefined1 *)local_680._0_8_ != local_680 + 0x10) {
          operator_delete((void *)local_680._0_8_,CONCAT71(local_680._17_7_,local_680[0x10]) + 1);
        }
        parent_abs_path_00 = (Path *)&parent_abs_path_00[4]._prim_part.field_2;
      } while (parent_abs_path_00 != local_6f0);
    }
    pPVar3 = local_708;
    ::std::__cxx11::string::_M_assign((string *)local_708);
    Path::operator=((Path *)&(pPVar3->_abs_path)._prop_part,(Path *)local_3b8);
    (pPVar3->_path)._prop_part._M_dataplus._M_p = (pointer)local_2f0._8_8_;
    (pPVar3->_path)._prop_part._M_string_length = local_2f0._16_8_;
    (pPVar3->_path)._prop_part.field_2._M_allocated_capacity = local_2f0._24_8_;
    ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
    operator=((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
              ((long)&(pPVar3->_path)._prop_part.field_2 + 8),
              (vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
              (local_2f0 + 0x20));
    memcpy(&(pPVar3->_path)._variant_part.field_2,&oStack_2c0.contained,0x188);
    bVar4 = true;
LAB_004d2127:
    ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::~vector
              ((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *)
               (local_2f0 + 0x20));
    if ((undefined1 *)local_328._16_8_ != local_328 + 0x20) {
      operator_delete((void *)local_328._16_8_,CONCAT71(local_328._33_7_,local_328[0x20]) + 1);
    }
    if (local_338._M_p != local_700) {
      operator_delete(local_338._M_p,CONCAT71(local_328._1_7_,local_328[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358 != &local_348) {
      operator_delete((void *)local_358,
                      CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) {
      operator_delete(local_378._M_p,
                      CONCAT71(local_368._M_allocated_capacity._1_7_,local_368._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_p != &local_388) {
      operator_delete(local_398._M_p,
                      CONCAT71(local_388._M_allocated_capacity._1_7_,local_388._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
    }
    if (local_3d8 != (vtable_type *)local_3c8) {
      operator_delete(local_3d8,CONCAT71(local_3c8._1_7_,local_3c8[0]) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool BuildXformNodeFromStageRec(
    const tinyusdz::Stage &stage, const Path &parent_abs_path, const Prim *prim,
    XformNode *nodeOut, /* out */
    value::matrix4d rootMat, const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!nodeOut) {
    return false;
  }

  XformNode node;

  if (prim->element_name().empty()) {
    // TODO: report error
  }

  node.element_name = prim->element_name();
  node.absolute_path = parent_abs_path.AppendPrim(prim->element_name());
  node.prim_id = prim->prim_id();
  node.prim = prim;  // Assume Prim's address does not change.

  DCOUT(prim->element_name() << ": IsXformablePrim" << IsXformablePrim(*prim));

  if (IsXformablePrim(*prim)) {
    bool resetXformStack{false};

    value::matrix4d localMat =
        GetLocalTransform(*prim, &resetXformStack, t, tinterp);
    DCOUT("local mat = " << localMat);

    value::matrix4d worldMat = rootMat;
    node.has_resetXformStack() = resetXformStack;

    value::matrix4d m;

    if (resetXformStack) {
      // Ignore parent Xform.
      m = localMat;
    } else {
      // matrix is row-major, so local first
      m = localMat * worldMat;
    }

    node.set_parent_world_matrix(rootMat);
    node.set_local_matrix(localMat);
    node.set_world_matrix(m);
    node.has_xform() = true;
  } else {
    DCOUT("Not xformable");
    node.has_xform() = false;
    node.has_resetXformStack() = false;
    node.set_parent_world_matrix(rootMat);
    node.set_world_matrix(rootMat);
    node.set_local_matrix(value::matrix4d::identity());
  }

  for (const auto &childPrim : prim->children()) {
    XformNode childNode;
    if (!BuildXformNodeFromStageRec(stage, node.absolute_path, &childPrim,
                                    &childNode, node.get_world_matrix(), t,
                                    tinterp)) {
      return false;
    }

    childNode.parent = &node;
    node.children.emplace_back(std::move(childNode));
  }

  (*nodeOut) = node;

  return true;
}